

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

bool xray_re::xr_file_system::file_exist(char *path)

{
  bool bVar1;
  bool local_52;
  undefined1 local_38 [8];
  CPath p;
  char *path_local;
  
  p.super_path._32_8_ = path;
  CPath::CPath((CPath *)local_38,path);
  CPath::make_preferred_abi_cxx11_((CPath *)local_38);
  bVar1 = std::filesystem::exists((path *)local_38);
  local_52 = false;
  if (bVar1) {
    local_52 = std::filesystem::is_regular_file((path *)local_38);
  }
  CPath::~CPath((CPath *)local_38);
  return local_52;
}

Assistant:

bool xr_file_system::file_exist(const char* path)
{
CPath p(path);

	p.make_preferred();

	return fs::exists(p) && fs::is_regular_file(p);
}